

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingC.c
# Opt level: O1

char * cmsysEncoding_DupToNarrow(wchar_t *str)

{
  size_t sVar1;
  char *__s;
  
  if (str == (wchar_t *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = wcstombs((char *)0x0,str,0);
    sVar1 = sVar1 + 1;
  }
  if ((sVar1 != 0) && (__s = (char *)malloc(sVar1), __s != (char *)0x0)) {
    *__s = '\0';
    if (str == (wchar_t *)0x0) {
      return __s;
    }
    wcstombs(__s,str,sVar1);
    return __s;
  }
  return (char *)0x0;
}

Assistant:

char* kwsysEncoding_DupToNarrow(const wchar_t* str)
{
  char* ret = NULL;
  size_t length = kwsysEncoding_wcstombs(0, str, 0) + 1;
  if(length > 0)
    {
    ret = (char*)malloc(length);
    if(ret)
      {
      ret[0] = 0;
      kwsysEncoding_wcstombs(ret, str, length);
      }
    }
  return ret;
}